

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

ExpandMacroResult
anon_unknown.dwarf_1197c6c::ExpandMacros
          (string *out,
          vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
          *macroExpanders,int version)

{
  char cVar1;
  _Any_data *p_Var2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ExpandMacroResult EVar7;
  char *pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  char *pcVar10;
  _Any_data *p_Var11;
  bool bVar12;
  string macroNamespace;
  string result;
  string macroName;
  undefined8 local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ExpandMacroResult local_70;
  int local_6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string *local_48;
  char *local_40;
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  *local_38;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  iVar6 = 0;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  bVar12 = out->_M_string_length == 0;
  local_6c = version;
  local_48 = out;
  local_38 = macroExpanders;
  if (!bVar12) {
    pcVar8 = (out->_M_dataplus)._M_p;
    pcVar10 = pcVar8 + out->_M_string_length;
    iVar6 = 0;
    local_40 = pcVar10;
    do {
      cVar1 = *pcVar8;
      if (iVar6 == 2) {
        if (cVar1 == '}') {
          p_Var11 = (_Any_data *)
                    (local_38->
                    super__Vector_base<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          p_Var2 = (_Any_data *)
                   (local_38->
                   super__Vector_base<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          pbVar9 = &local_b0;
          while( true ) {
            bVar4 = p_Var11 == p_Var2;
            EVar7 = (ExpandMacroResult)pbVar9;
            if (bVar4) break;
            uVar3 = (ulong)local_b8 >> 0x20;
            local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44((int)uVar3,local_6c);
            if (*(long *)(p_Var11 + 1) == 0) {
              std::__throw_bad_function_call();
            }
            EVar7 = (**(code **)(p_Var11->_M_pod_data + 0x18))
                              (p_Var11,&local_b0,&local_68,&local_90,(int *)&local_b8);
            pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)pbVar9 & 0xffffffff);
            if (EVar7 != Ignore) break;
            p_Var11 = p_Var11 + 2;
          }
          if (bVar4) {
            iVar6 = std::__cxx11::string::compare((char *)&local_b0);
            EVar7 = Error - (iVar6 == 0);
          }
          pcVar10 = local_40;
          iVar6 = 2;
          bVar4 = EVar7 == Ok;
          if (bVar4) {
            iVar6 = 0;
            local_b0._M_string_length = 0;
            *local_b0._M_dataplus._M_p = '\0';
            local_68._M_string_length = 0;
            *local_68._M_dataplus._M_p = '\0';
            EVar7 = local_70;
          }
        }
        else {
          std::__cxx11::string::push_back((char)&local_68);
          iVar6 = 2;
LAB_003467cd:
          bVar4 = true;
          EVar7 = local_70;
        }
      }
      else if (iVar6 == 1) {
        if (cVar1 != '{') {
          std::__cxx11::string::push_back((char)&local_b0);
          local_b8 = &local_b0;
          bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                *)&local_b8,(char **)(anonymous_namespace)::ValidPrefixes);
          if ((((bVar4) ||
               (bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                        ::operator()((_Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                      *)&local_b8,
                                     (char **)((anonymous_namespace)::ValidPrefixes + 8)), bVar4))
              || (bVar4 = __gnu_cxx::__ops::
                          _Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                          ::operator()((_Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                        *)&local_b8,
                                       (char **)((anonymous_namespace)::ValidPrefixes + 0x10)),
                 bVar4)) ||
             (bVar4 = __gnu_cxx::__ops::
                      _Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                      ::operator()((_Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                    *)&local_b8,
                                   (char **)((anonymous_namespace)::ValidPrefixes + 0x18)), bVar4))
          {
            iVar6 = 1;
          }
          else {
            std::__cxx11::string::push_back((char)&local_90);
            std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0._M_dataplus._M_p);
            local_b0._M_string_length = 0;
            *local_b0._M_dataplus._M_p = '\0';
            iVar6 = 0;
          }
          goto LAB_003467cd;
        }
        iVar5 = std::__cxx11::string::compare((char *)&local_b0);
        iVar6 = 2;
        bVar4 = true;
        EVar7 = local_70;
        if (((iVar5 != 0) &&
            (iVar5 = std::__cxx11::string::compare((char *)&local_b0), EVar7 = local_70, iVar5 != 0)
            ) && ((iVar5 = std::__cxx11::string::compare((char *)&local_b0), EVar7 = local_70,
                  iVar5 != 0 &&
                  (iVar5 = std::__cxx11::string::compare((char *)&local_b0), EVar7 = local_70,
                  iVar5 != 0)))) {
          std::__cxx11::string::push_back((char)&local_90);
          std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0._M_dataplus._M_p);
          std::__cxx11::string::push_back((char)&local_90);
          local_b0._M_string_length = 0;
          *local_b0._M_dataplus._M_p = '\0';
          iVar6 = 0;
          EVar7 = local_70;
        }
      }
      else {
        iVar6 = 1;
        bVar4 = true;
        EVar7 = local_70;
        if (cVar1 != '$') {
          iVar6 = 0;
          std::__cxx11::string::push_back((char)&local_90);
          EVar7 = local_70;
        }
      }
      local_70 = EVar7;
      if (!bVar4) break;
      pcVar8 = pcVar8 + 1;
      bVar12 = pcVar8 == pcVar10;
    } while (!bVar12);
  }
  EVar7 = local_70;
  if (bVar12) {
    if (iVar6 == 2) {
      EVar7 = Error;
    }
    else {
      if (iVar6 == 1) {
        std::__cxx11::string::push_back((char)&local_90);
        std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0._M_dataplus._M_p);
      }
      std::__cxx11::string::operator=((string *)local_48,(string *)&local_90);
      EVar7 = Ok;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return EVar7;
}

Assistant:

ExpandMacroResult ExpandMacros(
  std::string& out, const std::vector<MacroExpander>& macroExpanders,
  int version)
{
  std::string result;
  std::string macroNamespace;
  std::string macroName;

  enum class State
  {
    Default,
    MacroNamespace,
    MacroName,
  } state = State::Default;

  for (auto c : out) {
    switch (state) {
      case State::Default:
        if (c == '$') {
          state = State::MacroNamespace;
        } else {
          result += c;
        }
        break;

      case State::MacroNamespace:
        if (c == '{') {
          if (IsValidMacroNamespace(macroNamespace)) {
            state = State::MacroName;
          } else {
            result += '$';
            result += macroNamespace;
            result += '{';
            macroNamespace.clear();
            state = State::Default;
          }
        } else {
          macroNamespace += c;
          if (!PrefixesValidMacroNamespace(macroNamespace)) {
            result += '$';
            result += macroNamespace;
            macroNamespace.clear();
            state = State::Default;
          }
        }
        break;

      case State::MacroName:
        if (c == '}') {
          auto e = ExpandMacro(result, macroNamespace, macroName,
                               macroExpanders, version);
          if (e != ExpandMacroResult::Ok) {
            return e;
          }
          macroNamespace.clear();
          macroName.clear();
          state = State::Default;
        } else {
          macroName += c;
        }
        break;
    }
  }

  switch (state) {
    case State::Default:
      break;
    case State::MacroNamespace:
      result += '$';
      result += macroNamespace;
      break;
    case State::MacroName:
      return ExpandMacroResult::Error;
  }

  out = std::move(result);
  return ExpandMacroResult::Ok;
}